

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O3

pair<HighsImplications::VarBound_*,_bool> __thiscall
HighsHashTree<int,_HighsImplications::VarBound>::InnerLeaf<3>::insert_entry
          (InnerLeaf<3> *this,uint64_t fullHash,int hashPos,Entry *entry)

{
  int iVar1;
  ulong uVar2;
  byte bVar3;
  double dVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  undefined8 uVar8;
  ulong uVar9;
  ulong *puVar10;
  unsigned_long *puVar11;
  long lVar12;
  int *piVar13;
  ulong uVar14;
  pair<HighsImplications::VarBound_*,_bool> pVar15;
  uint local_24;
  
  uVar14 = fullHash >> ((char)hashPos * -6 + 0x30U & 0x3f);
  bVar3 = (byte)(uVar14 >> 10);
  uVar2 = (this->occupation).occupation;
  uVar6 = POPCOUNT(uVar2 >> (bVar3 & 0x3f));
  local_24 = (uint)uVar6;
  if ((uVar2 >> (uVar14 >> 10 & 0x3f) & 1) == 0) {
    (this->occupation).occupation = uVar2 | 1L << (bVar3 & 0x3f);
    uVar7 = this->size;
    if ((int)local_24 < (int)uVar7) {
      puVar11 = (this->hashes)._M_elems + uVar6;
      uVar6 = (ulong)(local_24 - 1);
      do {
        uVar6 = (ulong)((int)uVar6 + 1);
        uVar2 = *puVar11;
        puVar11 = puVar11 + 1;
      } while ((uVar14 & 0xffff) < uVar2);
      goto LAB_002a72e1;
    }
  }
  else {
    lVar12 = (ulong)(local_24 * 8) * -3 + -0x118;
    uVar6 = (ulong)(local_24 - 2);
    uVar2 = (ulong)(local_24 * 8);
    do {
      uVar9 = uVar2;
      lVar12 = lVar12 + -0x18;
      uVar5 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar5;
      uVar2 = uVar9 + 8;
    } while ((uVar14 & 0xffff) < *(ulong *)((long)(this->hashes)._M_elems + (uVar9 - 8)));
    uVar7 = this->size;
    if (uVar7 == uVar5) goto LAB_002a7301;
    puVar10 = (ulong *)((long)(this->hashes)._M_elems + (uVar9 - 8));
    piVar13 = (int *)((long)this - lVar12);
    do {
      if (*puVar10 != (uVar14 & 0xffff)) goto LAB_002a72e1;
      if (entry->key_ == *piVar13) {
        puVar11 = (this->hashes)._M_elems + (long)(int)uVar6 * 3 + -2;
        uVar8 = 0;
        goto LAB_002a7341;
      }
      uVar5 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar5;
      piVar13 = piVar13 + 6;
      puVar10 = puVar10 + 1;
    } while (uVar7 != uVar5);
    uVar6 = (ulong)uVar7;
LAB_002a72e1:
    local_24 = (uint)uVar6;
  }
  uVar5 = (uint)uVar6;
  if ((int)(uint)uVar6 < (int)uVar7) {
    move_backward(this,(int *)&local_24,&this->size);
    uVar5 = local_24;
  }
LAB_002a7301:
  puVar11 = (this->hashes)._M_elems + (long)(int)uVar5 * 3 + -2;
  puVar11[0x2b] = (unsigned_long)(entry->value_).constant;
  dVar4 = (entry->value_).coef;
  puVar11[0x29] = *(undefined8 *)entry;
  puVar11[0x2a] = (unsigned_long)dVar4;
  (this->hashes)._M_elems[(int)uVar5] = uVar14 & 0xffff;
  iVar1 = this->size;
  lVar12 = (long)iVar1 + 1;
  this->size = (int)lVar12;
  (this->hashes)._M_elems[(long)iVar1 + 1] = 0;
  uVar8 = CONCAT71((int7)((ulong)lVar12 >> 8),1);
LAB_002a7341:
  pVar15.first = (VarBound *)(puVar11 + 0x2a);
  pVar15._8_8_ = uVar8;
  return pVar15;
}

Assistant:

std::pair<ValueType*, bool> insert_entry(uint64_t fullHash, int hashPos,
                                             Entry& entry) {
      assert(size < capacity());
      uint16_t hash = get_hash_chunks16(fullHash, hashPos);
      uint8_t hashChunk = get_first_chunk16(hash);

      int pos = occupation.num_set_until(hashChunk);

      if (occupation.test(hashChunk)) {
        // since the occupation flag is set we need to start searching from
        // pos-1 and can rely on a hash chunk with the same value existing for
        // the scan
        --pos;
        while (hashes[pos] > hash) ++pos;

        if (find_key(entry.key(), hash, pos))
          return std::make_pair(&entries[pos].value(), false);

      } else {
        occupation.set(hashChunk);

        if (pos < size)
          while (hashes[pos] > hash) ++pos;
      }

      if (pos < size) move_backward(pos, size);
      entries[pos] = std::move(entry);
      hashes[pos] = hash;
      ++size;
      hashes[size] = 0;

      return std::make_pair(&entries[pos].value(), true);
    }